

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool __thiscall
re2::RE2::Match(RE2 *this,StringPiece *text,int startpos,int endpos,Anchor re_anchor,
               StringPiece *submatch,int nsubmatch)

{
  ostringstream *this_00;
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Anchor AVar5;
  ostream *poVar6;
  byte *pbVar7;
  Prog *pPVar8;
  long lVar9;
  byte *pbVar10;
  StringPiece *pSVar11;
  int *piVar12;
  char cVar13;
  undefined4 uVar14;
  ulong extraout_RDX;
  ulong uVar15;
  undefined7 uVar17;
  StringPiece *src;
  StringPiece *src_00;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  StringPiece *src_01;
  undefined8 extraout_RDX_02;
  StringPiece *src_02;
  StringPiece *src_03;
  undefined8 extraout_RDX_03;
  StringPiece *src_04;
  StringPiece *src_05;
  StringPiece *src_06;
  undefined8 extraout_RDX_04;
  StringPiece *src_07;
  StringPiece *src_08;
  StringPiece *src_09;
  StringPiece *src_10;
  undefined8 extraout_RDX_05;
  undefined8 uVar16;
  StringPiece *src_11;
  Anchor AVar18;
  Prog *pPVar19;
  ulong uVar20;
  byte *__s1;
  MatchKind kind;
  byte bVar21;
  ulong uVar22;
  Anchor anchor;
  MatchKind kind_00;
  int iVar23;
  byte bVar24;
  bool bVar25;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  bool dfa_failed;
  MatchKind local_264;
  string local_260;
  char *local_240;
  long local_238;
  char local_230 [16];
  ulong local_220;
  StringPiece local_218;
  Prog *local_200;
  StringPiece local_1f8;
  StringPiece *local_1e8;
  StringPiece *local_1e0;
  int local_1d8;
  int local_1d4;
  StringPiece match;
  LogMessage local_1c0;
  pointer local_40;
  undefined4 local_38;
  
  if ((this->error_code_ != NoError) || (this->suffix_regexp_ == (Regexp *)0x0)) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x222,2
              );
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0.str_,"Invalid RE2: ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1c0.str_,(this->error_->_M_dataplus)._M_p,
               this->error_->_M_string_length);
    goto LAB_001238ab;
  }
  if ((endpos < startpos || startpos < 0) || (text->length_ < endpos)) {
    if ((this->options_).log_errors_ != true) {
      return false;
    }
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x228,2
              );
    this_00 = &local_1c0.str_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"RE2: invalid startpos, endpos pair. [",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"startpos: ",10);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)this_00,startpos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"endpos: ",8);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,endpos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"text size: ",0xb);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,text->length_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
    goto LAB_001238ab;
  }
  local_218.ptr_ = text->ptr_ + (uint)startpos;
  local_218.length_ = (int)*(undefined8 *)&text->length_;
  local_218._12_4_ = SUB84((ulong)*(undefined8 *)&text->length_ >> 0x20,0);
  local_218.length_ = local_218.length_ + (endpos - (text->length_ + startpos));
  match.ptr_ = (char *)0x0;
  match.length_ = 0;
  pSVar11 = (StringPiece *)0x0;
  if (nsubmatch != 0) {
    pSVar11 = &match;
  }
  local_1e8 = text;
  local_1e0 = submatch;
  iVar3 = NumberOfCapturingGroups(this);
  uVar2 = iVar3 + 1;
  if (nsubmatch <= iVar3) {
    uVar2 = nsubmatch;
  }
  uVar22 = (ulong)uVar2;
  pPVar8 = this->prog_;
  bVar25 = pPVar8->anchor_start_;
  if ((startpos != 0 & bVar25) != 0) {
    return false;
  }
  if ((bVar25 == false) || (AVar5 = ANCHOR_BOTH, pPVar8->anchor_end_ == false)) {
    AVar5 = ANCHOR_START;
    if (bVar25 == false) {
      AVar5 = re_anchor;
    }
    if (re_anchor == ANCHOR_BOTH) {
      AVar5 = re_anchor;
    }
  }
  pPVar19 = (Prog *)(this->prefix_)._M_string_length;
  iVar3 = (int)pPVar19;
  if (pPVar19 == (Prog *)0x0) {
    pPVar19 = (Prog *)0x0;
  }
  else {
    if (startpos != 0) {
      return false;
    }
    iVar23 = local_218.length_ - iVar3;
    if (local_218.length_ < iVar3) {
      return false;
    }
    __s1 = (byte *)(this->prefix_)._M_dataplus._M_p;
    local_200 = pPVar8;
    if (this->prefix_foldcase_ == true) {
      if (0 < iVar3) {
        pbVar7 = __s1 + iVar3;
        pbVar10 = (byte *)local_218.ptr_;
        uVar15 = extraout_RDX;
        do {
          uVar20 = uVar15 & 0xffffffff;
          bVar24 = *__s1;
          bVar1 = *pbVar10;
          bVar21 = bVar1 | 0x20;
          if (0x19 < (byte)(bVar1 + 0xbf)) {
            bVar21 = bVar1;
          }
          uVar15 = (ulong)((uint)bVar24 - (uint)bVar21);
          if (bVar24 == bVar21) {
            uVar15 = uVar20;
          }
          iVar4 = (int)uVar15;
          if (bVar24 != bVar21) goto joined_r0x0012462d;
          __s1 = __s1 + 1;
          pbVar10 = pbVar10 + 1;
        } while (__s1 < pbVar7);
        iVar4 = 0;
        goto joined_r0x0012462d;
      }
    }
    else {
      iVar4 = bcmp(__s1,local_218.ptr_,(long)iVar3);
joined_r0x0012462d:
      if (iVar4 != 0) {
        return false;
      }
    }
    local_218.ptr_ = local_218.ptr_ + iVar3;
    local_218.length_ = iVar23;
    AVar5 = (AVar5 == ANCHOR_BOTH) + ANCHOR_START;
    pPVar8 = local_200;
  }
  bVar24 = (int)uVar2 < 6 & this->is_one_pass_;
  kind = (MatchKind)(this->options_).longest_match_;
  local_1d8 = pPVar8->size_;
  local_1d4 = (int)(0x40000 / (long)local_1d8);
  dfa_failed = false;
  if (AVar5 == ANCHOR_START) {
LAB_00123a52:
    local_200 = pPVar19;
    uVar17 = (undefined7)((ulong)local_1e8 >> 8);
    if (((bVar24 == 0) || (0x1000 < local_1e8->length_)) ||
       ((int)uVar2 < 2 && 8 < local_1e8->length_)) {
      if ((local_1d8 < 0x1f5) && (1 < (int)uVar2 && local_1e8->length_ <= local_1d4)) {
        uVar14 = (undefined4)CONCAT71(uVar17,1);
        AVar18 = kAnchored;
        if (FLAGS_trace_re2 == '\x01') {
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x2c5,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
          local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
          local_1f8.length_ = (int)(this->pattern_)._M_string_length;
          trunc_abi_cxx11_((re2 *)&local_240,
                           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1c0.str_,local_240,local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_00);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," skipping DFA for BitState.",0x1b);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          if (local_240 != local_230) {
            operator_delete(local_240);
          }
          goto LAB_001240cd;
        }
      }
      else {
        AVar18 = kAnchored;
        bVar25 = Prog::SearchDFA(pPVar8,&local_218,local_1e8,kAnchored,kind,&match,&dfa_failed,
                                 (vector<int,_std::allocator<int>_> *)0x0);
        if (bVar25) {
          uVar14 = 0;
        }
        else {
          if (dfa_failed != true) {
            if (FLAGS_trace_re2 == '\0') {
              return false;
            }
            LogMessage::LogMessage
                      (&local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                       ,0x2d6,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c0.str_,"Match ",6);
            local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
            local_1f8.length_ = (int)(this->pattern_)._M_string_length;
            trunc_abi_cxx11_((re2 *)&local_240,
                             (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1c0.str_,local_240,local_238);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
            CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_07);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," used DFA - no match.",0x15);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            if (local_240 != local_230) {
              operator_delete(local_240);
            }
            goto LAB_001238ab;
          }
          uVar14 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
          if (FLAGS_trace_re2 != '\0') {
            LogMessage::LogMessage
                      (&local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                       ,0x2cf,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c0.str_,"Match ",6);
            local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
            local_1f8.length_ = (int)(this->pattern_)._M_string_length;
            trunc_abi_cxx11_((re2 *)&local_240,
                             (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1c0.str_,local_240,local_238);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
            CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_03);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," DFA failed.",0xc);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            if (local_240 != local_230) {
              operator_delete(local_240);
            }
            goto LAB_001240cd;
          }
        }
      }
    }
    else {
      uVar14 = (undefined4)CONCAT71(uVar17,1);
      AVar18 = kAnchored;
      if (FLAGS_trace_re2 == '\x01') {
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x2bd,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
        local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
        local_1f8.length_ = (int)(this->pattern_)._M_string_length;
        trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1c0.str_,local_240,local_238);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
        CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," skipping DFA for OnePass.",0x1a)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if (local_240 != local_230) {
          operator_delete(local_240);
        }
LAB_001240cd:
        AVar18 = kAnchored;
        LogMessage::~LogMessage(&local_1c0);
        uVar16 = extraout_RDX_03;
        goto LAB_001240e0;
      }
    }
  }
  else {
    if (AVar5 == ANCHOR_BOTH) {
      kind = kFullMatch;
      goto LAB_00123a52;
    }
    local_264 = kind;
    local_220 = uVar22;
    bVar25 = Prog::SearchDFA(pPVar8,&local_218,local_1e8,kUnanchored,kind,pSVar11,&dfa_failed,
                             (vector<int,_std::allocator<int>_> *)0x0);
    pSVar11 = local_1e8;
    if (bVar25) {
      if (FLAGS_trace_re2 == '\x01') {
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x288,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
        local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
        local_1f8.length_ = (int)(this->pattern_)._M_string_length;
        trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)
                        );
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1c0.str_,local_240,local_238);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
        CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_01);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," used DFA - match",0x11);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p);
        }
        if (local_240 != local_230) {
          operator_delete(local_240);
        }
        LogMessage::~LogMessage(&local_1c0);
      }
      if (nsubmatch == 0) {
        return true;
      }
      local_200 = pPVar19;
      pPVar8 = ReverseProg(this);
      AVar18 = kUnanchored;
      if (pPVar8 == (Prog *)0x0) {
LAB_00124cce:
        bVar25 = false;
LAB_00124cd1:
        uVar14 = 0;
      }
      else {
        bVar25 = Prog::SearchDFA(pPVar8,&match,pSVar11,kAnchored,kLongestMatch,&match,&dfa_failed,
                                 (vector<int,_std::allocator<int>_> *)0x0);
        if (bVar25) {
          bVar25 = true;
          if (FLAGS_trace_re2 == '\x01') {
            LogMessage::LogMessage
                      (&local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                       ,0x2a7,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c0.str_,"Match ",6);
            local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
            local_1f8.length_ = (int)(this->pattern_)._M_string_length;
            trunc_abi_cxx11_((re2 *)&local_240,
                             (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1c0.str_,local_240,local_238);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
            CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_02);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," used reverse DFA.",0x12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            if (local_240 != local_230) {
              operator_delete(local_240);
            }
            LogMessage::~LogMessage(&local_1c0);
          }
          goto LAB_00124cd1;
        }
        if (dfa_failed != true) {
          if (FLAGS_trace_re2 != '\0') {
            LogMessage::LogMessage
                      (&local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                       ,0x29f,0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c0.str_,"Match ",6);
            local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
            local_1f8.length_ = (int)(this->pattern_)._M_string_length;
            trunc_abi_cxx11_((re2 *)&local_240,
                             (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_1c0.str_,local_240,local_238);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
            CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_11);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," DFA inconsistency.",0x13);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p);
            }
            if (local_240 != local_230) {
              operator_delete(local_240);
            }
            LogMessage::~LogMessage(&local_1c0);
          }
          if ((this->options_).log_errors_ == true) {
            LogMessage::LogMessage
                      (&local_1c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                       ,0x2a3,2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1c0.str_,"DFA inconsistency",0x11);
            LogMessage::~LogMessage(&local_1c0);
          }
          goto LAB_00124cce;
        }
        bVar25 = true;
        uVar16 = extraout_RDX_02;
        if (FLAGS_trace_re2 != '\0') {
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x299,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
          local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
          local_1f8.length_ = (int)(this->pattern_)._M_string_length;
          trunc_abi_cxx11_((re2 *)&local_240,
                           (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1c0.str_,local_240,local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_10);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," reverse DFA failed.",0x14);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          if (local_240 != local_230) {
            operator_delete(local_240);
          }
          LogMessage::~LogMessage(&local_1c0);
          uVar16 = extraout_RDX_05;
        }
        uVar14 = (undefined4)CONCAT71((int7)((ulong)uVar16 >> 8),1);
      }
      uVar22 = local_220;
      kind = local_264;
      if (!bVar25) {
        return false;
      }
      goto LAB_001240e2;
    }
    if (dfa_failed != true) {
      if (FLAGS_trace_re2 == '\0') {
        return false;
      }
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x282
                 ,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
      local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
      local_1f8.length_ = (int)(this->pattern_)._M_string_length;
      trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1c0.str_,local_240,local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
      CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_09);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," used DFA - no match.",0x15);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      goto LAB_001238ab;
    }
    local_200 = pPVar19;
    uVar14 = (undefined4)CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),1);
    AVar18 = kUnanchored;
    uVar22 = local_220;
    kind = local_264;
    if (FLAGS_trace_re2 == '\0') goto LAB_001240e2;
    LogMessage::LogMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x27c,0
              );
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
    local_1f8.ptr_ = (this->pattern_)._M_dataplus._M_p;
    local_1f8.length_ = (int)(this->pattern_)._M_string_length;
    trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_1c0.str_,local_240,local_238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
    CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_06);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," DFA failed.",0xc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p);
    }
    if (local_240 != local_230) {
      operator_delete(local_240);
    }
    LogMessage::~LogMessage(&local_1c0);
    AVar18 = kUnanchored;
    uVar16 = extraout_RDX_04;
    uVar22 = local_220;
    kind = local_264;
LAB_001240e0:
    uVar14 = (undefined4)CONCAT71((int7)((ulong)uVar16 >> 8),1);
  }
LAB_001240e2:
  pPVar8 = local_200;
  iVar3 = (int)uVar22;
  cVar13 = (char)uVar14;
  if (iVar3 < 2 && cVar13 == '\0') {
    pSVar11 = local_1e0;
    if (iVar3 == 1) {
      local_1e0->length_ = match.length_;
      local_1e0->ptr_ = match.ptr_;
    }
  }
  else {
    bVar25 = cVar13 != '\0';
    pSVar11 = &match;
    if (bVar25) {
      pSVar11 = &local_218;
    }
    local_1f8.ptr_ = (char *)0x0;
    anchor = kAnchored;
    if (bVar25) {
      anchor = AVar18;
    }
    local_1f8.length_ = 0;
    kind_00 = kFullMatch;
    if (bVar25) {
      kind_00 = kind;
    }
    local_1f8.length_ = pSVar11->length_;
    local_1f8.ptr_ = pSVar11->ptr_;
    if (bVar24 != 1 || anchor == kUnanchored) {
      local_220 = CONCAT44(local_220._4_4_,uVar14);
      if ((local_1d8 < 0x1f5) && (pSVar11->length_ <= local_1d4)) {
        if (FLAGS_trace_re2 != '\0') {
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x2fd,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
          local_40 = (this->pattern_)._M_dataplus._M_p;
          local_38 = (undefined4)(this->pattern_)._M_string_length;
          trunc_abi_cxx11_((re2 *)&local_240,
                           (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1c0.str_,local_240,local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_05);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," using BitState.",0x10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          if (local_240 != local_230) {
            operator_delete(local_240);
          }
          LogMessage::~LogMessage(&local_1c0);
        }
        pSVar11 = local_1e0;
        bVar25 = Prog::SearchBitState
                           (this->prog_,&local_1f8,local_1e8,anchor,kind_00,local_1e0,iVar3);
        if (bVar25) goto LAB_001248a1;
        if ((char)local_220 != '\0') {
          return false;
        }
        if ((this->options_).log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x303,2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c0.str_,"SearchBitState inconsistency",0x1c);
      }
      else {
        if (FLAGS_trace_re2 != '\0') {
          LogMessage::LogMessage
                    (&local_1c0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                     0x308,0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
          local_40 = (this->pattern_)._M_dataplus._M_p;
          local_38 = (undefined4)(this->pattern_)._M_string_length;
          trunc_abi_cxx11_((re2 *)&local_240,
                           (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_1c0.str_,local_240,local_238);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_08);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," using NFA.",0xb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p);
          }
          if (local_240 != local_230) {
            operator_delete(local_240);
          }
          LogMessage::~LogMessage(&local_1c0);
        }
        pSVar11 = local_1e0;
        bVar25 = Prog::SearchNFA(this->prog_,&local_1f8,local_1e8,anchor,kind_00,local_1e0,iVar3);
        if (bVar25) goto LAB_001248a1;
        if ((char)local_220 != '\0') {
          return false;
        }
        if ((this->options_).log_errors_ != true) {
          return false;
        }
        LogMessage::LogMessage
                  (&local_1c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",
                   0x30d,2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1c0.str_,"SearchNFA inconsistency",0x17);
      }
LAB_001238ab:
      LogMessage::~LogMessage(&local_1c0);
      return false;
    }
    if (FLAGS_trace_re2 == '\x01') {
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2f3
                 ,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1c0.str_,"Match ",6);
      local_40 = (this->pattern_)._M_dataplus._M_p;
      local_38 = (undefined4)(this->pattern_)._M_string_length;
      trunc_abi_cxx11_((re2 *)&local_240,(double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_1c0.str_,local_240,local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
      CEscape_abi_cxx11_(&local_260,(re2 *)&local_218,src_04);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_260._M_dataplus._M_p,local_260._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," using OnePass.",0xf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p);
      }
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      LogMessage::~LogMessage(&local_1c0);
    }
    pSVar11 = local_1e0;
    bVar25 = Prog::SearchOnePass(this->prog_,&local_1f8,local_1e8,kAnchored,kind_00,local_1e0,iVar3)
    ;
    if (!bVar25) {
      if (cVar13 != '\0') {
        return false;
      }
      if ((this->options_).log_errors_ != true) {
        return false;
      }
      LogMessage::LogMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc",0x2f8
                 ,2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1c0.str_,"SearchOnePass inconsistency",0x1b);
      goto LAB_001238ab;
    }
  }
LAB_001248a1:
  iVar23 = (int)pPVar8;
  if (0 < nsubmatch && 0 < iVar23) {
    pSVar11->ptr_ = pSVar11->ptr_ + -((ulong)pPVar8 & 0xffffffff);
    pSVar11->length_ = pSVar11->length_ + iVar23;
  }
  if (iVar3 < nsubmatch) {
    lVar9 = (long)nsubmatch - (long)iVar3;
    piVar12 = &local_1e0[iVar3].length_;
    do {
      ((StringPiece *)(piVar12 + -2))->ptr_ = (char *)0x0;
      *piVar12 = 0;
      piVar12 = piVar12 + 4;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  return true;
}

Assistant:

bool RE2::Match(const StringPiece& text,
                int startpos,
                int endpos,
                Anchor re_anchor,
                StringPiece* submatch,
                int nsubmatch) const {
  if (!ok() || suffix_regexp_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Invalid RE2: " << *error_;
    return false;
  }

  if (startpos < 0 || startpos > endpos || endpos > text.size()) {
    if (options_.log_errors())
      LOG(ERROR) << "RE2: invalid startpos, endpos pair. ["
                 << "startpos: " << startpos << ", "
                 << "endpos: " << endpos << ", "
                 << "text size: " << text.size() << "]";
    return false;
  }

  StringPiece subtext = text;
  subtext.remove_prefix(startpos);
  subtext.remove_suffix(text.size() - endpos);

  // Use DFAs to find exact location of match, filter out non-matches.

  // Don't ask for the location if we won't use it.
  // SearchDFA can do extra optimizations in that case.
  StringPiece match;
  StringPiece* matchp = &match;
  if (nsubmatch == 0)
    matchp = NULL;

  int ncap = 1 + NumberOfCapturingGroups();
  if (ncap > nsubmatch)
    ncap = nsubmatch;

  // If the regexp is anchored explicitly, must not be in middle of text.
  if (prog_->anchor_start() && startpos != 0)
    return false;

  // If the regexp is anchored explicitly, update re_anchor
  // so that we can potentially fall into a faster case below.
  if (prog_->anchor_start() && prog_->anchor_end())
    re_anchor = ANCHOR_BOTH;
  else if (prog_->anchor_start() && re_anchor != ANCHOR_BOTH)
    re_anchor = ANCHOR_START;

  // Check for the required prefix, if any.
  int prefixlen = 0;
  if (!prefix_.empty()) {
    if (startpos != 0)
      return false;
    prefixlen = static_cast<int>(prefix_.size());
    if (prefixlen > subtext.size())
      return false;
    if (prefix_foldcase_) {
      if (ascii_strcasecmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    } else {
      if (memcmp(&prefix_[0], subtext.data(), prefixlen) != 0)
        return false;
    }
    subtext.remove_prefix(prefixlen);
    // If there is a required prefix, the anchor must be at least ANCHOR_START.
    if (re_anchor != ANCHOR_BOTH)
      re_anchor = ANCHOR_START;
  }

  Prog::Anchor anchor = Prog::kUnanchored;
  Prog::MatchKind kind = Prog::kFirstMatch;
  if (options_.longest_match())
    kind = Prog::kLongestMatch;
  bool skipped_test = false;

  bool can_one_pass = (is_one_pass_ && ncap <= Prog::kMaxOnePassCapture);

  // SearchBitState allocates a bit vector of size prog_->size() * text.size().
  // It also allocates a stack of 3-word structures which could potentially
  // grow as large as prog_->size() * text.size() but in practice is much
  // smaller.
  // Conditions for using SearchBitState:
  const int MaxBitStateProg = 500;   // prog_->size() <= Max.
  const int MaxBitStateVector = 256*1024;  // bit vector size <= Max (bits)
  bool can_bit_state = prog_->size() <= MaxBitStateProg;
  int bit_state_text_max = MaxBitStateVector / prog_->size();

  bool dfa_failed = false;
  switch (re_anchor) {
    default:
    case UNANCHORED: {
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            matchp, &dfa_failed, NULL)) {
        if (dfa_failed) {
          // Fall back to NFA below.
          skipped_test = true;
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " DFA failed.";
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " used DFA - no match.";
        return false;
      }
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " used DFA - match";
      if (matchp == NULL)  // Matched.  Don't care where
        return true;
      // SearchDFA set match[0].end() but didn't know where the
      // match started.  Run the regexp backward from match[0].end()
      // to find the longest possible match -- that's where it started.
      Prog* prog = ReverseProg();
      if (prog == NULL)
        return false;
      if (!prog->SearchDFA(match, text, Prog::kAnchored,
                           Prog::kLongestMatch, &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          // Fall back to NFA below.
          skipped_test = true;
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " reverse DFA failed.";
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " DFA inconsistency.";
        if (options_.log_errors())
          LOG(ERROR) << "DFA inconsistency";
        return false;
      }
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " used reverse DFA.";
      break;
    }

    case ANCHOR_BOTH:
    case ANCHOR_START:
      if (re_anchor == ANCHOR_BOTH)
        kind = Prog::kFullMatch;
      anchor = Prog::kAnchored;

      // If only a small amount of text and need submatch
      // information anyway and we're going to use OnePass or BitState
      // to get it, we might as well not even bother with the DFA:
      // OnePass or BitState will be fast enough.
      // On tiny texts, OnePass outruns even the DFA, and
      // it doesn't have the shared state and occasional mutex that
      // the DFA does.
      if (can_one_pass && text.size() <= 4096 &&
          (ncap > 1 || text.size() <= 8)) {
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " skipping DFA for OnePass.";
        skipped_test = true;
        break;
      }
      if (can_bit_state && text.size() <= bit_state_text_max && ncap > 1) {
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " skipping DFA for BitState.";
        skipped_test = true;
        break;
      }
      if (!prog_->SearchDFA(subtext, text, anchor, kind,
                            &match, &dfa_failed, NULL)) {
        if (dfa_failed) {
          if (FLAGS_trace_re2)
            LOG(INFO) << "Match " << trunc(pattern_)
                      << " [" << CEscape(subtext) << "]"
                      << " DFA failed.";
          skipped_test = true;
          break;
        }
        if (FLAGS_trace_re2)
          LOG(INFO) << "Match " << trunc(pattern_)
                    << " [" << CEscape(subtext) << "]"
                    << " used DFA - no match.";
        return false;
      }
      break;
  }

  if (!skipped_test && ncap <= 1) {
    // We know exactly where it matches.  That's enough.
    if (ncap == 1)
      submatch[0] = match;
  } else {
    StringPiece subtext1;
    if (skipped_test) {
      // DFA ran out of memory or was skipped:
      // need to search in entire original text.
      subtext1 = subtext;
    } else {
      // DFA found the exact match location:
      // let NFA run an anchored, full match search
      // to find submatch locations.
      subtext1 = match;
      anchor = Prog::kAnchored;
      kind = Prog::kFullMatch;
    }

    if (can_one_pass && anchor != Prog::kUnanchored) {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using OnePass.";
      if (!prog_->SearchOnePass(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchOnePass inconsistency";
        return false;
      }
    } else if (can_bit_state && subtext1.size() <= bit_state_text_max) {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using BitState.";
      if (!prog_->SearchBitState(subtext1, text, anchor,
                                 kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchBitState inconsistency";
        return false;
      }
    } else {
      if (FLAGS_trace_re2)
        LOG(INFO) << "Match " << trunc(pattern_)
                  << " [" << CEscape(subtext) << "]"
                  << " using NFA.";
      if (!prog_->SearchNFA(subtext1, text, anchor, kind, submatch, ncap)) {
        if (!skipped_test && options_.log_errors())
          LOG(ERROR) << "SearchNFA inconsistency";
        return false;
      }
    }
  }

  // Adjust overall match for required prefix that we stripped off.
  if (prefixlen > 0 && nsubmatch > 0)
    submatch[0] = StringPiece(submatch[0].begin() - prefixlen,
                              submatch[0].size() + prefixlen);

  // Zero submatches that don't exist in the regexp.
  for (int i = ncap; i < nsubmatch; i++)
    submatch[i] = NULL;
  return true;
}